

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnTable
          (BinaryReaderObjdump *this,Index index,Type elem_type,Limits *elem_limits)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  const_pointer pcVar4;
  undefined1 local_38 [8];
  string_view name;
  Limits *elem_limits_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  Type elem_type_local;
  
  name.size_ = (size_type)elem_limits;
  this_local._0_4_ = elem_type.enum_;
  pcVar2 = Type::GetName((Type *)&this_local);
  PrintDetails(this," - table[%u] type=%s initial=%ld",(ulong)index,pcVar2,*(undefined8 *)name.size_
              );
  if ((*(byte *)(name.size_ + 0x10) & 1) != 0) {
    PrintDetails(this," max=%ld",*(undefined8 *)(name.size_ + 8));
  }
  _local_38 = BinaryReaderObjdumpBase::GetTableName(&this->super_BinaryReaderObjdumpBase,index);
  bVar1 = string_view::empty((string_view *)local_38);
  if (!bVar1) {
    sVar3 = string_view::length((string_view *)local_38);
    pcVar4 = string_view::data((string_view *)local_38);
    PrintDetails(this," <%.*s>",sVar3 & 0xffffffff,pcVar4);
  }
  PrintDetails(this,"\n");
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnTable(Index index,
                                    Type elem_type,
                                    const Limits* elem_limits) {
  PrintDetails(" - table[%" PRIindex "] type=%s initial=%" PRId64, index,
               elem_type.GetName(), elem_limits->initial);
  if (elem_limits->has_max) {
    PrintDetails(" max=%" PRId64, elem_limits->max);
  }
  auto name = GetTableName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails("\n");
  return Result::Ok;
}